

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O0

uint32_t basisu::set_block_bits(uint8_t *pBytes,uint64_t val,uint32_t num_bits,uint32_t cur_ofs)

{
  uint uVar1;
  uint in_ECX;
  uint in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint32_t n;
  uint64_t mask;
  ulong local_30;
  ulong local_20;
  uint local_18;
  uint local_14;
  ulong local_10;
  
  if (0x40 < in_EDX) {
    __assert_fail("num_bits <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                  ,0xe9f,"uint32_t basisu::set_block_bits(uint8_t *, uint64_t, uint32_t, uint32_t)")
    ;
  }
  if (in_EDX != 0x40 && (ulong)(1L << ((byte)in_EDX & 0x3f)) <= in_RSI) {
    __assert_fail("(num_bits == 64) || (val < (1ULL << num_bits))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                  ,0xea0,"uint32_t basisu::set_block_bits(uint8_t *, uint64_t, uint32_t, uint32_t)")
    ;
  }
  if (in_EDX == 0x40) {
    local_30 = 0xffffffffffffffff;
  }
  else {
    local_30 = (1L << ((byte)in_EDX & 0x3f)) - 1;
  }
  local_20 = local_30;
  local_18 = in_ECX;
  local_10 = in_RSI;
  for (local_14 = in_EDX; local_14 != 0; local_14 = local_14 - uVar1) {
    uVar1 = minimum<unsigned_int>(8 - (local_18 & 7),local_14);
    *(byte *)(in_RDI + (ulong)(local_18 >> 3)) =
         *(byte *)(in_RDI + (ulong)(local_18 >> 3)) &
         ((byte)(local_20 << ((byte)local_18 & 7)) ^ 0xff);
    *(byte *)(in_RDI + (ulong)(local_18 >> 3)) =
         *(byte *)(in_RDI + (ulong)(local_18 >> 3)) | (byte)(local_10 << ((byte)local_18 & 7));
    local_10 = local_10 >> ((byte)uVar1 & 0x3f);
    local_20 = local_20 >> ((byte)uVar1 & 0x3f);
    local_18 = uVar1 + local_18;
  }
  return local_18;
}

Assistant:

static inline uint32_t set_block_bits(uint8_t* pBytes, uint64_t val, uint32_t num_bits, uint32_t cur_ofs)
	{
		assert(num_bits <= 64);
		assert((num_bits == 64) || (val < (1ULL << num_bits)));
		uint64_t mask = (num_bits == 64) ? UINT64_MAX : ((1ULL << num_bits) - 1);
		while (num_bits)
		{
			const uint32_t n = basisu::minimum<uint32_t>(8U - (cur_ofs & 7U), num_bits);
			pBytes[cur_ofs >> 3] &= ~static_cast<uint8_t>(mask << (cur_ofs & 7U));
			pBytes[cur_ofs >> 3] |= static_cast<uint8_t>(val << (cur_ofs & 7U));
			val >>= n;
			mask >>= n;
			num_bits -= n;
			cur_ofs += n;
		}
		return cur_ofs;
	}